

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O1

void __thiscall
ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  FP *pFVar1;
  bool bVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  PositionType minPosition;
  PositionType maxPosition;
  AssertionResult gtest_ar;
  ParticleType particle;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Particle local_50;
  
  minPosition.y = -10.0;
  minPosition.x = -10.0;
  maxPosition.y = 10.0;
  maxPosition.x = 10.0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (&local_50,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,minPosition,
             maxPosition);
  dVar5 = *(double *)(pica::ParticleTypes::types + (long)local_50.typeIndex * 0x10);
  dVar6 = local_50.p.x * 29979245800.0 * dVar5;
  dVar7 = local_50.p.y * 29979245800.0 * dVar5;
  dVar4 = local_50.p.z * 29979245800.0 * dVar5;
  dVar5 = (dVar4 * dVar4 + dVar6 * dVar6 + dVar7 * dVar7) /
          (dVar5 * 29979245800.0 * dVar5 * 29979245800.0) + 1.0;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
            maxAbsoluteError;
  if (ABS(dVar5) < *pFVar1 || ABS(dVar5) == *pFVar1) {
    local_70.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ABS(dVar5 + -1.0 / local_50.invGamma);
    testing::internal::CmpHelperLE<double,double>
              (local_60,"fabs(expectedGamma - particle.getGamma())","this->maxAbsoluteError",
               (double *)&local_70,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
                maxAbsoluteError);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0xa3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
        local_70.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    local_70.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ABS((-1.0 / local_50.invGamma + dVar5) / dVar5);
    testing::internal::CmpHelperLE<double,double>
              (local_60,"fabs(expectedGamma - particle.getGamma()) / fabs(expectedGamma)",
               "this->maxRelativeError",(double *)&local_70,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
                maxRelativeError);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0xa3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
        local_70.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetGamma)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    GammaType expectedGamma = sqrt(static_cast<GammaType>(1.0) + particle.getMomentum().norm2() /
        sqr(particle.getMass() * Constants<GammaType>::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}